

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall sjtu::invalid_command::invalid_command(invalid_command *this)

{
  exception::exception(&this->super_exception);
  (this->super_exception)._vptr_exception = (_func_int **)&PTR_what_abi_cxx11__0011d888;
  (this->wro)._M_dataplus._M_p = (pointer)&(this->wro).field_2;
  (this->wro)._M_string_length = 0;
  (this->wro).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->wro);
  return;
}

Assistant:

invalid_command() {
	    wro = "invalid_command";
	}